

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::VectorTest_MoveConstructor_Test::~VectorTest_MoveConstructor_Test
          (VectorTest_MoveConstructor_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(VectorTest, MoveConstructor) {
  Vector<size_t> vec;
  for (size_t i = 0; i < 100; i++) {
    ASSERT_TRUE(vec.Push(i));
  }

  Vector<size_t> vec_moved(std::move(vec));
  for (size_t i = 0; i < 100; i++) {
    EXPECT_EQ(vec_moved[i], i);
  }
}